

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

void crnlib::etc1_block::unpack_delta3(int *r,int *g,int *b,uint16 packed_delta3)

{
  uint16 packed_delta3_local;
  int *b_local;
  int *g_local;
  int *r_local;
  
  *r = (int)(uint)packed_delta3 >> 6 & 7;
  *g = (int)(uint)packed_delta3 >> 3 & 7;
  *b = packed_delta3 & 7;
  if (3 < *r) {
    *r = *r + -8;
  }
  if (3 < *g) {
    *g = *g + -8;
  }
  if (3 < *b) {
    *b = *b + -8;
  }
  return;
}

Assistant:

void etc1_block::unpack_delta3(int& r, int& g, int& b, uint16 packed_delta3)
    {
        r = (packed_delta3 >> 6) & 7;
        g = (packed_delta3 >> 3) & 7;
        b = packed_delta3 & 7;
        if (r >= 4)
        {
            r -= 8;
        }
        if (g >= 4)
        {
            g -= 8;
        }
        if (b >= 4)
        {
            b -= 8;
        }
    }